

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

void __thiscall
TEST_DoublingFactorCounterTest_TerminalInEachSet_Open_Test::
TEST_DoublingFactorCounterTest_TerminalInEachSet_Open_Test
          (TEST_DoublingFactorCounterTest_TerminalInEachSet_Open_Test *this)

{
  _Rb_tree_header *p_Var1;
  WiningState *this_00;
  
  memset(this,0,0xc0);
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupDoublingFactorCounterTest_001d4d20;
  p_Var1 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.tiles._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.tiles._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.tiles._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.tiles._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.tiles._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.tiles._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.ready_type = not_ready;
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s;
  mahjong::WiningState::WiningState(this_00);
  mahjong::DoubligFactorCounter::DoubligFactorCounter
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c,
             &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h,this_00);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupDoublingFactorCounterTest_001d44c8;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, TerminalInEachSet_Open)
{
	addPair(Tile::NineOfCharacters);
	addSequence(Tile::OneOfCharacters, true);
	addTriplet(Tile::NineOfCircles, false);
	addSequence(Tile::OneOfBamboos, false);
	addSequence(Tile::SevenOfBamboos, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TerminalInEachSet));
	CHECK_EQUAL(0, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(2, r.doubling_factor);
}